

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

QString * __thiscall
QPlainTextEdit::anchorAt(QString *__return_storage_ptr__,QPlainTextEdit *this,QPoint *pos)

{
  QPlainTextEditPrivate *this_00;
  QPlainTextEditControl *pQVar1;
  QScrollBar *this_01;
  undefined1 auVar2 [16];
  double dVar3;
  qreal qVar4;
  double dVar5;
  LayoutDirection LVar6;
  int iVar7;
  int iVar8;
  QTextDocument *pQVar9;
  long in_FS_OFFSET;
  double dStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  double local_48;
  double dStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QPlainTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  pQVar1 = this_00->control;
  dVar3 = (double)(*pos).xp.m_i;
  dVar5 = (double)(*pos).yp.m_i;
  auVar2._8_4_ = SUB84(dVar5,0);
  auVar2._0_8_ = dVar3;
  auVar2._12_4_ = (int)((ulong)dVar5 >> 0x20);
  LVar6 = QWidget::layoutDirection
                    (*(QWidget **)
                      &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                       super_QWidgetPrivate.field_0x8);
  this_01 = (this_00->super_QAbstractScrollAreaPrivate).hbar;
  if (LVar6 == RightToLeft) {
    iVar7 = QAbstractSlider::maximum(&this_01->super_QAbstractSlider);
    iVar8 = QAbstractSlider::value
                      (&((this_00->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider);
    iVar7 = iVar7 - iVar8;
  }
  else {
    iVar7 = QAbstractSlider::value(&this_01->super_QAbstractSlider);
  }
  qVar4 = QPlainTextEditPrivate::verticalOffset(this_00,this_00->control->topBlock,this_00->topLine)
  ;
  local_48 = (double)iVar7 + dVar3;
  dStack_60 = auVar2._8_8_;
  dStack_40 = qVar4 + this_00->topLineFracture + dStack_60;
  iVar7 = (**(code **)(*(long *)&pQVar1->super_QWidgetTextControl + 0x78))(pQVar1,&local_48,0);
  if (iVar7 < 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pQVar9 = QWidgetTextControl::document
                       (*(QWidgetTextControl **)
                         (*(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.
                                    field_0x8 + 800));
    QFragmentMapData<QTextFragmentData>::findNode
              ((QFragmentMapData<QTextFragmentData> *)(*(long *)(pQVar9 + 8) + 0x158),iVar7,0);
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QTextFormatCollection::format((int)(QTextFormat *)&local_48);
    QTextFormat::toCharFormat();
    QTextFormat::~QTextFormat((QTextFormat *)&local_48);
    QTextFormat::stringProperty((int)__return_storage_ptr__);
    QTextFormat::~QTextFormat((QTextFormat *)&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QPlainTextEdit::anchorAt(const QPoint &pos) const
{
    Q_D(const QPlainTextEdit);
    int cursorPos = d->control->hitTest(pos + QPointF(d->horizontalOffset(),
                                                     d->verticalOffset()),
                                        Qt::ExactHit);
    if (cursorPos < 0)
        return QString();

    QTextDocumentPrivate *pieceTable = QTextDocumentPrivate::get(document());
    QTextDocumentPrivate::FragmentIterator it = pieceTable->find(cursorPos);
    QTextCharFormat fmt = pieceTable->formatCollection()->charFormat(it->format);
    return fmt.anchorHref();
}